

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1_enc.cc
# Opt level: O3

int SSL_export_keying_material
              (SSL *s,uchar *out,size_t olen,char *label,size_t llen,uchar *p,size_t plen,
              int use_context)

{
  code cVar1;
  _func_3149 *p_Var2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  string_view label_00;
  Span<const_unsigned_char> context;
  bool bVar6;
  uint16_t uVar7;
  int iVar8;
  SSL_SESSION *session;
  EVP_MD *digest;
  size_t new_size;
  int line;
  uint uVar9;
  Span<const_unsigned_char> secret;
  Span<unsigned_char> out_00;
  Array<unsigned_char> seed;
  Array<unsigned_char> local_78;
  char *local_60;
  size_t local_58;
  uchar *local_50;
  uchar *puStack_48;
  size_t local_40;
  char *pcStack_38;
  
  local_58 = llen;
  if ((*(short *)(s->handshake_func + 0xd0) == 0) ||
     (uVar7 = bssl::ssl_protocol_version((SSL *)s), uVar7 < 0x304)) {
    iVar8 = SSL_in_init((SSL *)s);
    if ((iVar8 == 0) || (iVar8 = SSL_in_false_start((SSL *)s), iVar8 != 0)) {
      if (use_context == 0) {
        new_size = 0x40;
      }
      else {
        if (0xffff < plen) {
          iVar8 = 0x45;
          line = 0xe8;
          goto LAB_001614cf;
        }
        new_size = plen + 0x42;
      }
      local_78.data_ = (uint8_t *)0x0;
      local_78.size_ = 0;
      local_60 = label;
      bVar6 = bssl::Array<unsigned_char>::InitUninitialized(&local_78,new_size);
      uVar9 = 0;
      if (bVar6) {
        p_Var2 = s->handshake_func;
        uVar3 = *(undefined8 *)(p_Var2 + 0x30);
        uVar4 = *(undefined8 *)(p_Var2 + 0x38);
        uVar5 = *(undefined8 *)(p_Var2 + 0x48);
        *(undefined8 *)(local_78.data_ + 0x10) = *(undefined8 *)(p_Var2 + 0x40);
        *(undefined8 *)(local_78.data_ + 0x18) = uVar5;
        *(undefined8 *)local_78.data_ = uVar3;
        *(undefined8 *)(local_78.data_ + 8) = uVar4;
        p_Var2 = s->handshake_func;
        uVar3 = *(undefined8 *)(p_Var2 + 0x18);
        uVar4 = *(undefined8 *)(p_Var2 + 0x20);
        uVar5 = *(undefined8 *)(p_Var2 + 0x28);
        *(undefined8 *)(local_78.data_ + 0x20) = *(undefined8 *)(p_Var2 + 0x10);
        *(undefined8 *)(local_78.data_ + 0x28) = uVar3;
        *(undefined8 *)(local_78.data_ + 0x30) = uVar4;
        *(undefined8 *)(local_78.data_ + 0x38) = uVar5;
        if (use_context != 0) {
          if ((local_78.size_ < 0x41) ||
             (local_78.data_[0x40] = (uint8_t)(plen >> 8), local_78.size_ == 0x41)) {
            abort();
          }
          local_78.data_[0x41] = (uint8_t)plen;
          if (plen != 0) {
            memcpy(local_78.data_ + 0x42,p,plen);
          }
        }
        session = SSL_get_session(s);
        digest = bssl::ssl_session_get_digest((SSL_SESSION *)session);
        iVar8 = CRYPTO_tls1_prf(digest,out,olen,session->key_arg + 2,(ulong)session->session_id[2],
                                local_60,local_58,local_78.data_,local_78.size_,(uint8_t *)0x0,0);
        uVar9 = (uint)(iVar8 == 1);
      }
      OPENSSL_free(local_78.data_);
      return uVar9;
    }
    iVar8 = 0x11c;
    line = 0xe1;
  }
  else {
    cVar1 = s->handshake_func[0x1e2];
    if (cVar1 != (code)0x0) {
      secret.data_ = s->handshake_func + 0x1a2;
      local_50 = p;
      puStack_48 = (uchar *)plen;
      if (use_context == 0) {
        local_50 = (uchar *)0x0;
        puStack_48 = (uchar *)0x0;
      }
      local_40 = local_58;
      label_00._M_str = label;
      label_00._M_len = local_58;
      context.size_ = (size_t)puStack_48;
      context.data_ = local_50;
      secret.size_._0_1_ = cVar1;
      secret.size_._1_7_ = 0;
      out_00.size_ = olen;
      out_00.data_ = out;
      pcStack_38 = label;
      bVar6 = bssl::tls13_export_keying_material((SSL *)s,out_00,secret,label_00,context);
      return (uint)bVar6;
    }
    iVar8 = 0x11c;
    line = 0xd3;
  }
LAB_001614cf:
  ERR_put_error(0x10,0,iVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/t1_enc.cc"
                ,line);
  return 0;
}

Assistant:

int SSL_export_keying_material(const SSL *ssl, uint8_t *out, size_t out_len,
                               const char *label, size_t label_len,
                               const uint8_t *context, size_t context_len,
                               int use_context) {
  auto out_span = Span(out, out_len);
  std::string_view label_sv(label, label_len);
  // In TLS 1.3, the exporter may be used whenever the secret has been derived.
  if (ssl->s3->version != 0 && ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
    if (ssl->s3->exporter_secret.empty()) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_HANDSHAKE_NOT_COMPLETE);
      return 0;
    }
    if (!use_context) {
      context = nullptr;
      context_len = 0;
    }
    return tls13_export_keying_material(ssl, out_span, ssl->s3->exporter_secret,
                                        label_sv, Span(context, context_len));
  }

  // Exporters may be used in False Start, where the handshake has progressed
  // enough. Otherwise, they may not be used during a handshake.
  if (SSL_in_init(ssl) && !SSL_in_false_start(ssl)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_HANDSHAKE_NOT_COMPLETE);
    return 0;
  }

  size_t seed_len = 2 * SSL3_RANDOM_SIZE;
  if (use_context) {
    if (context_len >= 1u << 16) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
      return 0;
    }
    seed_len += 2 + context_len;
  }
  Array<uint8_t> seed;
  if (!seed.InitForOverwrite(seed_len)) {
    return 0;
  }

  OPENSSL_memcpy(seed.data(), ssl->s3->client_random, SSL3_RANDOM_SIZE);
  OPENSSL_memcpy(seed.data() + SSL3_RANDOM_SIZE, ssl->s3->server_random,
                 SSL3_RANDOM_SIZE);
  if (use_context) {
    seed[2 * SSL3_RANDOM_SIZE] = static_cast<uint8_t>(context_len >> 8);
    seed[2 * SSL3_RANDOM_SIZE + 1] = static_cast<uint8_t>(context_len);
    OPENSSL_memcpy(seed.data() + 2 * SSL3_RANDOM_SIZE + 2, context,
                   context_len);
  }

  const SSL_SESSION *session = SSL_get_session(ssl);
  const EVP_MD *digest = ssl_session_get_digest(session);
  return tls1_prf(digest, out_span, session->secret, label_sv, seed, {});
}